

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_file_system.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::VirtualFileSystem::ListSubSystems_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,VirtualFileSystem *this)

{
  reference this_00;
  pointer pFVar1;
  reference this_01;
  ulong __n;
  allocator_type aaStack_48 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,
           (long)(this->sub_systems).
                 super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->sub_systems).
                 super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,aaStack_48);
  for (__n = 0; __n < (ulong)((long)(this->sub_systems).
                                    super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->sub_systems).
                                    super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_true>
              ::get<true>(&this->sub_systems,__n);
    pFVar1 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->(this_00);
    (*pFVar1->_vptr_FileSystem[0x27])(aaStack_48,pFVar1);
    this_01 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(__return_storage_ptr__,__n);
    ::std::__cxx11::string::operator=((string *)this_01,(string *)aaStack_48);
    ::std::__cxx11::string::~string((string *)aaStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> VirtualFileSystem::ListSubSystems() {
	vector<string> names(sub_systems.size());
	for (idx_t i = 0; i < sub_systems.size(); i++) {
		names[i] = sub_systems[i]->GetName();
	}
	return names;
}